

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O3

streamsize __thiscall
stream::inno_exe_decoder_4108::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_4108 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  byte *pbVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (0 < n) {
    uVar4 = 0;
    do {
      pbVar1 = *(byte **)&src->field_0x10;
      if (pbVar1 < *(byte **)&src->field_0x18) {
        uVar2 = (uint)*pbVar1;
        *(byte **)&src->field_0x10 = pbVar1 + 1;
      }
      else {
        uVar2 = (**(code **)(*(long *)src + 0x50))(src);
        if (uVar2 == 0xffffffff) {
          uVar2 = src->flags_ | 0xfffffffe;
        }
      }
      if (uVar2 == 0xfffffffe) {
        return uVar4;
      }
      if (uVar2 == 0xffffffff) {
        return uVar4 | -(ulong)(uVar4 == 0);
      }
      if (this->addr_bytes_left == 0) {
        if ((uVar2 & 0xfffffffe) == 0xe8) {
          this->addr = -this->addr_offset;
          sVar3 = 4;
          goto LAB_0014c8cd;
        }
      }
      else {
        uVar2 = (uVar2 & 0xff) + this->addr;
        this->addr = uVar2 >> 8;
        sVar3 = this->addr_bytes_left - 1;
LAB_0014c8cd:
        this->addr_bytes_left = sVar3;
      }
      dest[uVar4] = (char)uVar2;
      uVar4 = uVar4 + 1;
      this->addr_offset = this->addr_offset + 1;
    } while (n != uVar4);
  }
  return n;
}

Assistant:

std::streamsize inno_exe_decoder_4108::read(Source & src, char * dest, std::streamsize n) {
	
	for(std::streamsize i = 0; i < n; i++, addr_offset++) {
		
		int byte = boost::iostreams::get(src);
		if(byte == EOF) { return i ? i : EOF; }
		if(byte == boost::iostreams::WOULD_BLOCK) { return i; }
		
		if(addr_bytes_left == 0) {
			
			// Check if this is a CALL or JMP instruction.
			if(byte == 0xe8 || byte == 0xe9) {
				addr = ~addr_offset + 1;
				addr_bytes_left = 4;
			}
			
		} else {
			addr += boost::uint8_t(byte);
			byte = boost::uint8_t(addr);
			addr >>= 8;
			addr_bytes_left--;
		}
		
		*dest++ = char(boost::uint8_t(byte));
	}
	
	return n;
}